

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatchkit.hpp
# Opt level: O2

void __thiscall chaiscript::detail::Dispatch_Engine::~Dispatch_Engine(Dispatch_Engine *this)

{
  State::~State(&this->m_state);
  threading::Thread_Storage<chaiscript::detail::Stack_Holder>::~Thread_Storage
            (&this->m_stack_holder);
  Type_Conversions::~Type_Conversions(&this->m_conversions);
  return;
}

Assistant:

~Dispatch_Engine()
        {
        }